

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.h
# Opt level: O1

void __thiscall
Js::InterpreterStackFrame::
OP_ProfiledCallI<Js::OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>
          (InterpreterStackFrame *this,
          OpLayoutDynamicProfile<Js::OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>_>
          *playout)

{
  Var value;
  RecyclableObject *function;
  
  value = *(Var *)(this + (ulong)(playout->
                                 super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>).
                                 Function * 8 + 0x160);
  ValidateRegValue(this,value,true,true);
  function = JavascriptOperators::GetCallableObjectOrThrow(value,*(ScriptContext **)(this + 0x78));
  OP_ProfileCallCommon<Js::OpLayoutDynamicProfile<Js::OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>__unaligned>
            (this,playout,function,0,playout->profileId,0xffffffff,(AuxArray<unsigned_int> *)0x0);
  return;
}

Assistant:

void OP_ProfiledCallIFlags(const unaligned T* playout) { OP_ProfileCallCommon(playout, OP_CallGetFunc(GetRegAllowStackVar(playout->Function)), playout->callFlags, playout->profileId); }